

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

bool __thiscall
cmOrderDirectoriesConstraint::FileMayConflict
          (cmOrderDirectoriesConstraint *this,string *dir,string *name)

{
  bool bVar1;
  _Self local_d0;
  _Self local_c8;
  const_iterator fi;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string file;
  string *name_local;
  string *dir_local;
  cmOrderDirectoriesConstraint *this_local;
  
  file.field_2._8_8_ = name;
  cmAlphaNum::cmAlphaNum(&local_78,dir);
  cmAlphaNum::cmAlphaNum(&local_a8,'/');
  cmStrCat<std::__cxx11::string>
            ((string *)local_48,&local_78,&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)file.field_2._8_8_
            );
  bVar1 = cmsys::SystemTools::FileExists((string *)local_48,true);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::SameFile(&this->FullPath,(string *)local_48);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    fi._M_node = (_Base_ptr)cmGlobalGenerator::GetDirectoryContent(this->GlobalGenerator,dir,false);
    local_c8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)fi._M_node,(key_type *)file.field_2._8_8_);
    local_d0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(fi._M_node);
    this_local._7_1_ = std::operator!=(&local_c8,&local_d0);
  }
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmOrderDirectoriesConstraint::FileMayConflict(std::string const& dir,
                                                   std::string const& name)
{
  // Check if the file exists on disk.
  std::string file = cmStrCat(dir, '/', name);
  if (cmSystemTools::FileExists(file, true)) {
    // The file conflicts only if it is not the same as the original
    // file due to a symlink or hardlink.
    return !cmSystemTools::SameFile(this->FullPath, file);
  }

  // Check if the file will be built by cmake.
  std::set<std::string> const& files =
    (this->GlobalGenerator->GetDirectoryContent(dir, false));
  auto fi = files.find(name);
  return fi != files.end();
}